

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2AddrModeImm12(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint uVar3;
  DecodeStatus In;
  uint imm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  imm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,0xd,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,0xc);
  uVar3 = MCInst_getOpcode(pMStack_18);
  if ((((uVar3 == 0xa2b) || (uVar3 == 0xa39)) || (uVar3 == 0xa40)) && (RegNo == 0xf)) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    In = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&imm,In);
    if (_Var1) {
      MCOperand_CreateImm0(pMStack_18,(ulong)uVar2);
      Inst_local._4_4_ = imm;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm12(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 12);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRi12:
		case ARM_t2STRBi12:
		case ARM_t2STRHi12:
			if (Rn == 15)
				return MCDisassembler_Fail;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}